

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Line *this;
  Rectangle *this_00;
  Color local_8b;
  Coordinate local_88;
  shared_ptr<editor::figures::CanvasPrimitive> line;
  CanvasController controller;
  shared_ptr<editor::figures::CanvasPrimitive> rectangle;
  string local_50;
  MainView view;
  GraphicDocument local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"-- creating new document --");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_28.elements.
  super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.elements.
  super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.elements.
  super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  editor::MainView::MainView(&view,&local_28);
  editor::CanvasController::CanvasController(&controller,&local_28,&view);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- loading document from file --");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"document.ed",(allocator<char> *)&line);
  editor::CanvasController::import_document(&controller,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- adding line --");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (Line *)operator_new(0x20);
  editor::Color::Color((Color *)&local_88,0xff,0xff,'\0');
  local_50._M_dataplus._M_p = (pointer)0x0;
  rectangle.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x100000001;
  editor::figures::Line::Line
            (this,(Color *)&local_88,(Coordinate *)&local_50,(Coordinate *)&rectangle);
  std::__shared_ptr<editor::figures::CanvasPrimitive,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<editor::figures::Line,void>
            ((__shared_ptr<editor::figures::CanvasPrimitive,(__gnu_cxx::_Lock_policy)2> *)&line,this
            );
  editor::CanvasController::add_primitive(&controller,&line);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- adding rectangle --");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (Rectangle *)operator_new(0x20);
  editor::Color::Color(&local_8b,'\0',0xff,'\0');
  local_50._M_dataplus._M_p = (pointer)0x1400000014;
  local_88.x = 100;
  local_88.y = 100;
  editor::figures::Rectangle::Rectangle(this_00,&local_8b,(Coordinate *)&local_50,&local_88);
  std::__shared_ptr<editor::figures::CanvasPrimitive,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<editor::figures::Rectangle,void>
            ((__shared_ptr<editor::figures::CanvasPrimitive,(__gnu_cxx::_Lock_policy)2> *)&rectangle
             ,this_00);
  editor::CanvasController::add_primitive(&controller,&rectangle);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- removing line --");
  std::endl<char,std::char_traits<char>>(poVar1);
  editor::CanvasController::remove_primitive(&controller,&line);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- saving document to file --");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"document_modified.ed",(allocator<char> *)&local_88);
  editor::CanvasController::export_document(&controller,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rectangle.
              super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&line.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ::~vector(&local_28.elements);
  return 0;
}

Assistant:

int main() {
    std::cout << "-- creating new document --" << std::endl;
    editor::GraphicDocument model{}; // create new document
    editor::MainView view{model};
    editor::CanvasController controller(model, view);

    std::cout << "-- loading document from file --" << std::endl;
    controller.import_document("document.ed");

    namespace ef = editor::figures;
    std::cout << "-- adding line --" << std::endl;
    auto line = std::shared_ptr<ef::CanvasPrimitive>(
            new ef::Line{editor::Color{255, 255, 0}, editor::Coordinate{0, 0}, editor::Coordinate{1, 1}});
    controller.add_primitive(line);

    std::cout << "-- adding rectangle --" << std::endl;
    auto rectangle = std::shared_ptr<ef::CanvasPrimitive>(
            new ef::Rectangle{editor::Color{0, 255, 0}, editor::Coordinate{20, 20}, editor::Coordinate{100, 100}});
    controller.add_primitive(rectangle);

    std::cout << "-- removing line --" << std::endl;
    controller.remove_primitive(line);

    std::cout << "-- saving document to file --" << std::endl;
    controller.export_document("document_modified.ed");

    return 0;
}